

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall
Diligent::ThreadPoolImpl::ThreadPoolImpl
          (ThreadPoolImpl *this,IReferenceCounters *pRefCounters,ThreadPoolCreateInfo *PoolCI)

{
  type local_88;
  uint local_30;
  Uint32 i;
  ThreadPoolCreateInfo *local_20;
  ThreadPoolCreateInfo *PoolCI_local;
  IReferenceCounters *pRefCounters_local;
  ThreadPoolImpl *this_local;
  
  local_20 = PoolCI;
  PoolCI_local = (ThreadPoolCreateInfo *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::IThreadPool>::ObjectBase
            (&this->super_ObjectBase<Diligent::IThreadPool>,pRefCounters);
  (this->super_ObjectBase<Diligent::IThreadPool>).super_RefCountedObject<Diligent::IThreadPool>.
  super_IThreadPool.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_01410698;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->m_WorkerThreads);
  std::mutex::mutex(&this->m_TasksQueueMtx);
  std::
  multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::multimap(&this->m_TasksQueue);
  std::
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::vector(&this->m_ReprioritizationList);
  std::condition_variable::condition_variable(&this->m_NextTaskCond);
  std::condition_variable::condition_variable(&this->m_TasksFinishedCond);
  std::atomic<bool>::atomic(&this->m_Stop,false);
  std::atomic<int>::atomic(&this->m_NumRunningTasks,0);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            (&this->m_WorkerThreads,local_20->NumThreads);
  for (local_30 = 0; (ulong)local_30 < local_20->NumThreads; local_30 = local_30 + 1) {
    local_88.this = this;
    ThreadPoolCreateInfo::ThreadPoolCreateInfo(&local_88.PoolCI,local_20);
    local_88.i = local_30;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<Diligent::ThreadPoolImpl::ThreadPoolImpl(Diligent::IReferenceCounters*,Diligent::ThreadPoolCreateInfo_const&)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->m_WorkerThreads,&local_88);
    ThreadPoolImpl(Diligent::IReferenceCounters*,Diligent::ThreadPoolCreateInfo_const&)::
    {lambda()#1}::~ThreadPoolCreateInfo((_lambda___1_ *)&local_88);
  }
  return;
}

Assistant:

ThreadPoolImpl(IReferenceCounters*         pRefCounters,
                   const ThreadPoolCreateInfo& PoolCI) :
        TBase{pRefCounters}
    {
        m_WorkerThreads.reserve(PoolCI.NumThreads);
        for (Uint32 i = 0; i < PoolCI.NumThreads; ++i)
        {
            m_WorkerThreads.emplace_back(
                [this, PoolCI, i] //
                {
                    if (PoolCI.OnThreadStarted)
                        PoolCI.OnThreadStarted(i);

                    while (ProcessTask(i, /*WaitForTask =*/true))
                    {
                    }

                    if (PoolCI.OnThreadExiting)
                        PoolCI.OnThreadExiting(i);
                });
        }
    }